

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcSizeAutoFit(ImGuiWindow *window,ImVec2 *size_contents)

{
  undefined1 auVar1 [16];
  ImGuiContext *pIVar2;
  uint uVar3;
  uint uVar4;
  ImVec2 IVar5;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar15;
  float fVar16;
  undefined1 auVar13 [16];
  float fVar17;
  undefined1 auVar14 [16];
  float local_28;
  float fStack_24;
  ImVec2 IVar6;
  
  pIVar2 = GImGui;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    auVar13._8_8_ = 0;
    auVar13._0_4_ = (GImGui->Style).WindowMinSize.x;
    auVar13._4_4_ = (GImGui->Style).WindowMinSize.y;
    if ((window->Flags & 0x14000000U) != 0) {
      auVar13 = minps(auVar13,_DAT_00194ef0);
    }
    IVar6 = (GImGui->Style).DisplaySafeAreaPadding;
    fVar10 = IVar6.x;
    fVar11 = IVar6.y;
    IVar6 = (GImGui->IO).DisplaySize;
    fVar10 = IVar6.x - (fVar10 + fVar10);
    fVar11 = IVar6.y - (fVar11 + fVar11);
    fVar12 = auVar13._0_4_;
    fVar15 = auVar13._4_4_;
    fVar16 = auVar13._8_4_;
    fVar17 = auVar13._12_4_;
    uVar3 = -(uint)(fVar10 <= fVar12);
    uVar4 = -(uint)(fVar11 <= fVar15);
    auVar9._0_4_ = ~uVar3 & (uint)fVar10;
    auVar9._4_4_ = ~uVar4 & (uint)fVar11;
    auVar9._8_8_ = 0;
    auVar1._4_4_ = (uint)fVar15 & uVar4;
    auVar1._0_4_ = (uint)fVar12 & uVar3;
    auVar1._8_4_ = (uint)fVar16 & -(uint)(0.0 <= fVar16);
    auVar1._12_4_ = (uint)fVar17 & -(uint)(0.0 <= fVar17);
    IVar6 = *size_contents;
    auVar7._8_8_ = 0;
    auVar7._0_4_ = IVar6.x;
    auVar7._4_4_ = IVar6.y;
    auVar13 = minps(auVar9 | auVar1,auVar7);
    uVar3 = -(uint)(IVar6.x < fVar12);
    uVar4 = -(uint)(IVar6.y < fVar15);
    auVar14._0_4_ = (uint)fVar12 & uVar3;
    auVar14._4_4_ = (uint)fVar15 & uVar4;
    auVar14._8_4_ = (uint)fVar16 & -(uint)(0.0 < fVar16);
    auVar14._12_4_ = (uint)fVar17 & -(uint)(0.0 < fVar17);
    auVar8._0_4_ = ~uVar3 & auVar13._0_4_;
    auVar8._4_4_ = ~uVar4 & auVar13._4_4_;
    auVar8._8_4_ = ~-(uint)(0.0 < fVar16) & auVar13._8_4_;
    auVar8._12_4_ = ~-(uint)(0.0 < fVar17) & auVar13._12_4_;
    auVar8 = auVar8 | auVar14;
    IVar6 = auVar8._0_8_;
    IVar5 = CalcSizeAfterConstraint(window,IVar6);
    if ((IVar5.x < size_contents->x) && ((window->Flags & 0x808U) == 0x800)) {
      local_28 = auVar8._0_4_;
      fStack_24 = auVar8._4_4_;
      IVar6.y = fStack_24 + (pIVar2->Style).ScrollbarSize;
      IVar6.x = local_28;
    }
    if ((IVar5.y < size_contents->y) && ((window->Flags & 8) == 0)) {
      IVar6.x = IVar6.x + (pIVar2->Style).ScrollbarSize;
    }
  }
  else {
    IVar6 = *size_contents;
  }
  return IVar6;
}

Assistant:

static ImVec2 CalcSizeAutoFit(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_contents;
    }
    else
    {
        // When the window cannot fit all contents (either because of constraints, either because screen is too small): we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than DisplaySize-WindowPadding.
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));
        ImVec2 size_auto_fit = ImClamp(size_contents, size_min, ImMax(size_min, g.IO.DisplaySize - style.DisplaySafeAreaPadding * 2.0f));
        ImVec2 size_auto_fit_after_constraint = CalcSizeAfterConstraint(window, size_auto_fit);
        if (size_auto_fit_after_constraint.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar))
            size_auto_fit.y += style.ScrollbarSize;
        if (size_auto_fit_after_constraint.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar))
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}